

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void minja::Value::dump_string(json *primitive,ostringstream *out,char string_quote)

{
  bool bVar1;
  runtime_error *this;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  char in_DL;
  ostream *in_RSI;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_RDI;
  size_t n;
  size_t i;
  string_t s;
  error_handler_t in_stack_000001fc;
  undefined1 in_stack_00000202;
  char in_stack_00000203;
  int in_stack_00000204;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_00000208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  ulong local_98;
  string local_88 [35];
  undefined1 local_65;
  string local_38 [39];
  char local_11;
  ostream *local_10;
  
  local_11 = in_DL;
  local_10 = in_RSI;
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::is_string(in_RDI);
  if (bVar1) {
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::dump(in_stack_00000208,in_stack_00000204,in_stack_00000203,(bool)in_stack_00000202,
           in_stack_000001fc);
    if ((local_11 == '\"') || (lVar2 = std::__cxx11::string::find((char)local_88,0x27), lVar2 != -1)
       ) {
      std::operator<<(local_10,local_88);
    }
    else {
      std::operator<<(local_10,local_11);
      local_98 = 1;
      lVar2 = std::__cxx11::string::size();
      for (; local_98 < lVar2 - 1U; local_98 = local_98 + 1) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_88);
        if ((*pcVar3 == '\\') &&
           (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_88), *pcVar3 == '\"')) {
          std::operator<<(local_10,'\"');
          local_98 = local_98 + 1;
        }
        else {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_88);
          poVar4 = local_10;
          if (*pcVar3 == local_11) {
            poVar4 = std::operator<<(local_10,'\\');
            std::operator<<(poVar4,local_11);
          }
          else {
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_88);
            std::operator<<(poVar4,*pcVar3);
          }
        }
      }
      std::operator<<(local_10,local_11);
    }
    std::__cxx11::string::~string(local_88);
    return;
  }
  local_65 = 1;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::dump(in_stack_00000208,in_stack_00000204,in_stack_00000203,(bool)in_stack_00000202,
         in_stack_000001fc);
  std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::runtime_error::runtime_error(this,local_38);
  local_65 = 0;
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void dump_string(const json & primitive, std::ostringstream & out, char string_quote = '\'') {
    if (!primitive.is_string()) throw std::runtime_error("Value is not a string: " + primitive.dump());
    auto s = primitive.dump();
    if (string_quote == '"' || s.find('\'') != std::string::npos) {
      out << s;
      return;
    }
    // Reuse json dump, just changing string quotes
    out << string_quote;
    for (size_t i = 1, n = s.size() - 1; i < n; ++i) {
      if (s[i] == '\\' && s[i + 1] == '"') {
        out << '"';
        i++;
      } else if (s[i] == string_quote) {
        out << '\\' << string_quote;
      } else {
        out << s[i];
      }
    }
    out << string_quote;
  }